

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

cmInstalledFile * __thiscall cmake::GetInstalledFile(cmake *this,string *name)

{
  const_iterator cVar1;
  cmInstalledFile *pcVar2;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile>_>_>
          ::find(&(this->InstalledFiles)._M_t,name);
  pcVar2 = (cmInstalledFile *)0x0;
  if ((_Rb_tree_header *)cVar1._M_node != &(this->InstalledFiles)._M_t._M_impl.super__Rb_tree_header
     ) {
    pcVar2 = (cmInstalledFile *)(cVar1._M_node + 2);
  }
  return pcVar2;
}

Assistant:

cmInstalledFile const* cmake::GetInstalledFile(const std::string& name) const
{
  std::map<std::string, cmInstalledFile>::const_iterator i =
    this->InstalledFiles.find(name);

  if (i != this->InstalledFiles.end()) {
    cmInstalledFile const& file = i->second;
    return &file;
  }
  return CM_NULLPTR;
}